

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O2

int __thiscall chrono::collision::CHOBBTree::build_model(CHOBBTree *this,double envelope)

{
  int iVar1;
  
  this->current_box = 1;
  build_recurse(this,0,0,(this->super_ChCollisionTree).num_geometries,envelope);
  if (build_model(double)::R == '\0') {
    iVar1 = __cxa_guard_acquire(&build_model(double)::R);
    if (iVar1 != 0) {
      __cxa_guard_release(&build_model(double)::R);
    }
  }
  if (build_model(double)::T == '\0') {
    iVar1 = __cxa_guard_acquire(&build_model(double)::T);
    if (iVar1 != 0) {
      build_model::T.m_data[2] = 0.0;
      build_model::T.m_data[0] = 0.0;
      build_model::T.m_data[1] = 0.0;
      __cxa_guard_release(&build_model(double)::T);
    }
  }
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_false>::run
            (&build_model::R.super_Matrix<double,_3,_3,_1,_3,_3>);
  build_model::T.m_data[0] = VNULL;
  build_model::T.m_data[1] = DAT_011dd3e0;
  build_model::T.m_data[2] = DAT_011dd3e8;
  make_parent_relative(this,0,&build_model::R,&build_model::T);
  return 0;
}

Assistant:

int CHOBBTree::build_model(double envelope) {
    // set num_bvs to 1, the first index for a child bv

    current_box = 1;

    // build recursively

    build_recurse(this, 0, 0, num_geometries, envelope);

    // change BV orientations from world-relative to parent-relative

    static ChMatrix33<> R;
    static Vector T;

    R.setIdentity();
    T = VNULL;

    make_parent_relative(this, 0, R, T);

    return ChC_OK;
}